

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O0

bool lua_zx_trdimage_create(char *trdname,char *label)

{
  undefined1 uVar1;
  bool bVar2;
  char *local_80;
  char *local_68;
  path local_60;
  byte local_35;
  int local_34;
  bool result;
  undefined1 *puStack_30;
  int positionsAdded;
  char *l8_ptr;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char l8 [9];
  char *label_local;
  char *trdname_local;
  
  l8_ptr._7_1_ = ' ';
  cStack_20 = ' ';
  cStack_1f = ' ';
  cStack_1e = ' ';
  cStack_1d = ' ';
  cStack_1c = ' ';
  cStack_1b = ' ';
  cStack_1a = ' ';
  l8[0] = '\0';
  puStack_30 = (undefined1 *)((long)&l8_ptr + 7);
  l8._1_8_ = label;
  while( true ) {
    bVar2 = false;
    if ((l8._1_8_ != 0) && (bVar2 = false, *(char *)l8._1_8_ != '\0')) {
      bVar2 = (long)puStack_30 - ((long)&l8_ptr + 7) < 8;
    }
    if (!bVar2) break;
    uVar1 = *(undefined1 *)l8._1_8_;
    l8._1_8_ = l8._1_8_ + 1;
    *puStack_30 = uVar1;
    puStack_30 = puStack_30 + 1;
  }
  local_34 = addLuaSourcePositions();
  local_80 = trdname;
  if (trdname == (char *)0x0) {
    local_80 = "";
  }
  local_68 = local_80;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_60,&local_68,auto_format);
  bVar2 = TRD_SaveEmpty(&local_60,(char *)((long)&l8_ptr + 7));
  std::filesystem::__cxx11::path::~path(&local_60);
  local_35 = bVar2;
  removeLuaSourcePositions(local_34);
  return (bool)(local_35 & 1);
}

Assistant:

static bool lua_zx_trdimage_create(const char* trdname, const char* label = nullptr) {
	// setup label to truncated 8 char array padded with spaces
	char l8[9] = "        ";
	char* l8_ptr = l8;
	while (label && *label && (l8_ptr - l8) < 8) *l8_ptr++ = *label++;
	int positionsAdded = addLuaSourcePositions();	// add known script positions to sourcePosStack vector
	bool result = TRD_SaveEmpty(trdname ? trdname : "", l8);
	removeLuaSourcePositions(positionsAdded);
	return result;
}